

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void __thiscall ChatClient::incomingData(ChatClient *this,Stream *stream)

{
  undefined1 local_68 [8];
  string line_1;
  undefined1 local_38 [8];
  string line;
  Stream *stream_local;
  ChatClient *this_local;
  
  line.field_2._8_8_ = stream;
  if (this->inputStream == (Stream *)0x0) {
    __assert_fail("inputStream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/examples/chat.cpp"
                  ,0x62,"virtual void ChatClient::incomingData(Stream *)");
  }
  if (this->remoteStream != (Stream *)0x0) {
    if (stream == this->inputStream) {
      readLine_abi_cxx11_((string *)local_38,this->inputStream);
      sendString(this->remoteStream,(string *)local_38);
      std::__cxx11::string::~string((string *)local_38);
    }
    else {
      readLine_abi_cxx11_((string *)local_68,this->remoteStream);
      std::operator<<((ostream *)&std::cout,(string *)local_68);
      std::ostream::flush();
      std::__cxx11::string::~string((string *)local_68);
    }
    return;
  }
  __assert_fail("remoteStream",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/examples/chat.cpp"
                ,99,"virtual void ChatClient::incomingData(Stream *)");
}

Assistant:

void incomingData(Stream* stream)
	{
		assert(inputStream);
		assert(remoteStream);

		if (stream == inputStream)
		{
			string line = readLine(inputStream);
			sendString(remoteStream, line);
		}
		else
		{
			string line = readLine(remoteStream);
			cout << line;
			cout.flush();
		}
	}